

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItemWithAttributes
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var value,PropertyAttributes attributes)

{
  code *pcVar1;
  uint32 key;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  IndexPropertyDescriptorMap *pIVar5;
  void **ppvVar6;
  undefined4 *puVar7;
  IndexPropertyDescriptor local_70;
  RecyclableObject *local_58;
  RecyclableObject *func;
  IndexPropertyDescriptor *descriptor;
  byte local_39;
  Type TStack_38;
  PropertyAttributes attributes_local;
  Var value_local;
  Type TStack_28;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  local_39 = attributes;
  TStack_38.ptr = (RuntimeFunction *)value;
  value_local._4_4_ = index;
  TStack_28.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  bVar2 = CanSetItemAt(this,arr,index);
  if (bVar2) {
    bVar2 = DynamicObject::GetHasNoEnumerableProperties(instance_local);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x1e8,"(!arr->GetHasNoEnumerableProperties())",
                                  "!arr->GetHasNoEnumerableProperties()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((local_39 & 4) == 0) {
      DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
      bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
      if ((bVar3 & 0x20) != 0) {
        RecyclableObject::GetLibrary((RecyclableObject *)TStack_28.ptr);
        JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                  ((JavascriptLibrary *)&descriptor);
        this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                  operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                              *)&descriptor);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
      }
    }
    pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                       (&this->indexPropertyMap);
    bVar2 = IndexPropertyDescriptorMap::TryGetReference
                      (pIVar5,value_local._4_4_,(IndexPropertyDescriptor **)&func);
    if (bVar2) {
      if (((ulong)(func->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 8) != 0) {
        ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&func->type);
        if ((*ppvVar6 != (void *)0x0) ||
           (ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                ((WriteBarrierPtr *)(func + 1)), *ppvVar6 != (void *)0x0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                      ,0x1f8,"(!descriptor->Getter && !descriptor->Setter)",
                                      "!descriptor->Getter && !descriptor->Setter");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        *(byte *)&(func->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject = local_39;
        Js::JavascriptArray::DirectSetItemAt<void*>
                  ((JavascriptArray *)instance_local,value_local._4_4_,TStack_38.ptr);
        return 1;
      }
      *(byte *)&(func->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject = local_39;
      BVar4 = HasDataItem(this,(ES5Array *)instance_local,value_local._4_4_);
      if (BVar4 == 0) {
        ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)(func + 1));
        if (*ppvVar6 != (void *)0x0) {
          ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)(func + 1));
          local_58 = VarTo<Js::RecyclableObject>(*ppvVar6);
          Js::JavascriptOperators::CallSetter
                    (local_58,TStack_28.ptr,TStack_38.ptr,(ScriptContext *)0x0);
        }
      }
      else {
        Js::JavascriptArray::DirectSetItemAt<void*>
                  ((JavascriptArray *)instance_local,value_local._4_4_,TStack_38.ptr);
      }
    }
    else {
      bVar2 = DynamicObject::GetHasNoEnumerableProperties(instance_local);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                    ,0x20e,"(!arr->GetHasNoEnumerableProperties())",
                                    "!arr->GetHasNoEnumerableProperties()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      Js::JavascriptArray::DirectSetItemAt<void*>
                ((JavascriptArray *)instance_local,value_local._4_4_,TStack_38.ptr);
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      key = value_local._4_4_;
      IndexPropertyDescriptor::IndexPropertyDescriptor(&local_70,local_39,(Var)0x0,(Var)0x0);
      IndexPropertyDescriptorMap::Add(pIVar5,key,&local_70);
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes(ES5Array* arr, DynamicObject* instance, uint32 index, Var value, PropertyAttributes attributes)
    {
        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return false;
        }

        // We don't track non-enumerable items in object array.  Objects with an object array
        // report having enumerable properties.  See DynamicObject::GetHasNoEnumerableProperties.
        // Array objects (which don't have an object array, and could report their hasNoEnumerableProperties
        // directly) take an explicit type transition before switching to ES5ArrayTypeHandler, so their
        // hasNoEnumerableProperties flag gets cleared.
        Assert(!arr->GetHasNoEnumerableProperties());

        if (!(attributes & PropertyWritable))
        {
            this->ClearHasOnlyWritableDataProperties();
            if(this->GetFlags() & this->IsPrototypeFlag)
            {
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
            }
        }

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                Assert(!descriptor->Getter && !descriptor->Setter);
                descriptor->Attributes = attributes;
                arr->DirectSetItemAt(index, value);
                return true;
            }

            descriptor->Attributes = attributes;

            if (HasDataItem(arr, index))
            {
                arr->DirectSetItemAt(index, value);
            }
            else if (descriptor->Setter)
            {
                RecyclableObject* func = VarTo<RecyclableObject>(descriptor->Setter);
                // TODO : request context
                JavascriptOperators::CallSetter(func, instance, value, NULL);
            }
        }
        else
        {
            // See comment for the same assert above.
            Assert(!arr->GetHasNoEnumerableProperties());

            // Not found in attribute map
            arr->DirectSetItemAt(index, value);
            indexPropertyMap->Add(index, IndexPropertyDescriptor(attributes));
        }

        return true;
    }